

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

VisitError<void> * __thiscall
Fixpp::TypedParsingContext<void>::toVisitError
          (VisitError<void> *__return_storage_ptr__,TypedParsingContext<void> *this)

{
  undefined1 local_48 [48];
  
  if ((this->super_ParsingContext).error.empty_ == false) {
    ErrorKind::ErrorKind((ErrorKind *)local_48,(ErrorKind *)&(this->super_ParsingContext).error);
    result::Result<void,_Fixpp::ErrorKind>::Result
              (__return_storage_ptr__,(Err<Fixpp::ErrorKind> *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
  }
  else {
    __return_storage_ptr__->ok_ = true;
    (__return_storage_ptr__->storage_).initialized_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

VisitError<void> toVisitError() const
        {
            if (hasError())
                return result::Err(error.get());
            return result::Ok();
        }